

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_bit_color_map.hpp
# Opt level: O1

void __thiscall
boost::
two_bit_color_map<boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>_>
::two_bit_color_map(two_bit_color_map<boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>_>
                    *this,size_t n,
                   vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>
                   *index)

{
  uchar *puVar1;
  ulong __n;
  
  this->n = n;
  __n = n + 3 >> 2;
  puVar1 = (uchar *)operator_new__(__n);
  (this->data).px = puVar1;
  detail::shared_count::shared_count<unsigned_char*,boost::checked_array_deleter<unsigned_char>>
            (&(this->data).pn);
  if (n + 3 < 4) {
    return;
  }
  memset((this->data).px,0,__n);
  return;
}

Assistant:

explicit two_bit_color_map(std::size_t n, const IndexMap& index = IndexMap())
    : n(n), index(index), data(new unsigned char[(n + elements_per_char - 1) / elements_per_char])
  {
    // Fill to white
    std::fill(data.get(), data.get() + (n + elements_per_char - 1) / elements_per_char, 0);
  }